

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
int_writer<unsigned_int,_fmt::v5::basic_format_specs<char>_>::on_hex
          (int_writer<unsigned_int,_fmt::v5::basic_format_specs<char>_> *this)

{
  uint uVar1;
  bool bVar2;
  int_writer<unsigned_int,fmt::v5::basic_format_specs<char>> iVar3;
  int_writer<unsigned_int,fmt::v5::basic_format_specs<char>> *in_RDI;
  basic_format_specs<char> *in_stack_00000040;
  uint num_digits;
  undefined1 in_stack_00000058 [16];
  undefined1 in_stack_00000070 [16];
  
  bVar2 = basic_format_specs<char>::flag(*(basic_format_specs<char> **)(in_RDI + 8),8);
  if (bVar2) {
    uVar1 = *(uint *)(in_RDI + 0x18);
    *(uint *)(in_RDI + 0x18) = uVar1 + 1;
    in_RDI[(ulong)uVar1 + 0x14] = (int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>)0x30;
    iVar3 = (int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>)
            basic_format_specs<char>::type(*(basic_format_specs<char> **)(in_RDI + 8));
    uVar1 = *(uint *)(in_RDI + 0x18);
    *(uint *)(in_RDI + 0x18) = uVar1 + 1;
    in_RDI[(ulong)uVar1 + 0x14] = iVar3;
  }
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
  int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::count_digits<4u>(in_RDI);
  get_prefix((int_writer<unsigned_int,_fmt::v5::basic_format_specs<char>_> *)0x13f177);
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
  write_int<fmt::v5::basic_format_specs<char>,fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::hex_writer>
            ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *)
             this,num_digits,(string_view)in_stack_00000058,in_stack_00000040,
             (hex_writer)in_stack_00000070);
  return;
}

Assistant:

void on_hex() {
      if (spec.flag(HASH_FLAG)) {
        prefix[prefix_size++] = '0';
        prefix[prefix_size++] = static_cast<char>(spec.type());
      }
      unsigned num_digits = count_digits<4>();
      writer.write_int(num_digits, get_prefix(), spec,
                       hex_writer{*this, num_digits});
    }